

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

pid_t proc_spawn(char **args)

{
  uint uVar1;
  pid_t pid;
  __pid_t _Var2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  char *__format;
  char *__s;
  uint uStack_34;
  char **ppcStack_30;
  
  ppcStack_30 = (char **)0x10279c;
  uVar1 = fork();
  if (uVar1 != 0) {
    ppcStack_30 = (char **)0x1027b2;
    printf("Spawning process [PID=%d]:",(ulong)uVar1);
    __s = *args;
    if (__s != (char *)0x0) {
      ppcVar5 = args + 1;
      do {
        ppcStack_30 = (char **)0x1027d9;
        pcVar4 = strchr(__s,0x20);
        __format = " \'%s\'";
        if (pcVar4 == (char *)0x0) {
          __format = " %s";
        }
        ppcStack_30 = (char **)0x1027ed;
        printf(__format,__s);
        __s = *ppcVar5;
        ppcVar5 = ppcVar5 + 1;
      } while (__s != (char *)0x0);
    }
    ppcStack_30 = (char **)0x102803;
    putchar(10);
    return uVar1;
  }
  ppcStack_30 = (char **)proc_spawn_sync;
  ppcVar5 = args;
  proc_spawn_cold_1();
  ppcStack_30 = args;
  pid = proc_spawn(ppcVar5);
  uStack_34 = 0;
  _Var2 = waitpid(0,(int *)&uStack_34,0);
  if (_Var2 < 0) {
    proc_spawn_sync_cold_1();
  }
  else if (((uStack_34 & 0x7f) == 0) ||
          (0x1ffffff < (int)((uStack_34 & 0x7f) * 0x1000000 + 0x1000000))) {
    iVar3 = wstatus_to_exit_status(pid,uStack_34);
    return iVar3;
  }
  __assert_fail("WIFEXITED(wstatus) || WIFSIGNALED(wstatus)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                ,0x69,"int proc_spawn_sync(char *const *)");
}

Assistant:

pid_t proc_spawn(char *const args[]) {
    pid_t pid = 0;
    if ((pid = fork()) == 0) {

#if !SHARE_STDIN
        close(STDIN_FILENO);
#endif
#if !SHARE_STDOUT
        close(STDOUT_FILENO);
#endif
#if !SHARE_STDERR
        close(STDERR_FILENO);
#endif

        //
        // Close opened filedescriptors from parent
        //
        for (int i = STDERR_FILENO + 1; i < 256; i++)
            close(i);

#if !SHARE_PROCESS_GROUP
        setsid();
#endif

        execvp(args[0], args);
        perror("Failed");
        exit(EXIT_FAILURE);
    }

    printf("Spawning process [PID=%d]:", pid);
    for (int32_t i = 0; args[i] != NULL; i++) {
        if (strchr(args[i], ' ')) {
            printf(" '%s'", args[i]);
        } else {
            printf(" %s", args[i]);
        }
    }
    printf("\n");
    return pid;
}